

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver_query.hpp
# Opt level: O0

void __thiscall
asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
          (basic_resolver_query<asio::ip::tcp> *this,string *host,string *service,
          flags resolve_flags)

{
  int iVar1;
  tcp local_58;
  tcp local_54;
  undefined1 local_50 [8];
  endpoint endpoint;
  flags resolve_flags_local;
  string *service_local;
  string *host_local;
  basic_resolver_query<asio::ip::tcp> *this_local;
  
  (this->hints_).ai_canonname = (char *)0x0;
  (this->hints_).ai_next = (addrinfo *)0x0;
  *(undefined8 *)&(this->hints_).ai_addrlen = 0;
  (this->hints_).ai_addr = (sockaddr *)0x0;
  (this->hints_).ai_flags = 0;
  (this->hints_).ai_family = 0;
  (this->hints_).ai_socktype = 0;
  (this->hints_).ai_protocol = 0;
  std::__cxx11::string::string((string *)&this->host_name_,host);
  std::__cxx11::string::string((string *)&this->service_name_,service);
  basic_endpoint<asio::ip::tcp>::basic_endpoint((basic_endpoint<asio::ip::tcp> *)local_50);
  (this->hints_).ai_flags = resolve_flags;
  (this->hints_).ai_family = 0;
  local_54.family_ =
       (int)basic_endpoint<asio::ip::tcp>::protocol((basic_endpoint<asio::ip::tcp> *)local_50);
  iVar1 = tcp::type(&local_54);
  (this->hints_).ai_socktype = iVar1;
  local_58.family_ =
       (int)basic_endpoint<asio::ip::tcp>::protocol((basic_endpoint<asio::ip::tcp> *)local_50);
  iVar1 = tcp::protocol(&local_58);
  (this->hints_).ai_protocol = iVar1;
  (this->hints_).ai_addrlen = 0;
  (this->hints_).ai_canonname = (char *)0x0;
  (this->hints_).ai_addr = (sockaddr *)0x0;
  (this->hints_).ai_next = (addrinfo *)0x0;
  return;
}

Assistant:

basic_resolver_query(const std::string& host, const std::string& service,
      resolver_query_base::flags resolve_flags = address_configured)
    : hints_(),
      host_name_(host),
      service_name_(service)
  {
    typename InternetProtocol::endpoint endpoint;
    hints_.ai_flags = static_cast<int>(resolve_flags);
    hints_.ai_family = ASIO_OS_DEF(AF_UNSPEC);
    hints_.ai_socktype = endpoint.protocol().type();
    hints_.ai_protocol = endpoint.protocol().protocol();
    hints_.ai_addrlen = 0;
    hints_.ai_canonname = 0;
    hints_.ai_addr = 0;
    hints_.ai_next = 0;
  }